

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O1

void __thiscall
compressed_distance_matrix<(compressed_matrix_layout)1>::compressed_distance_matrix
          (compressed_distance_matrix<(compressed_matrix_layout)1> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  long lVar1;
  ulong uVar2;
  float fVar3;
  allocator_type local_11;
  
  std::vector<float,_std::allocator<float>_>::vector(&this->distances,_distances);
  uVar2 = (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar1 = uVar2 * 2 + 1;
  if (lVar1 < 0) {
    fVar3 = (float)(uVar2 & 0x7fffffffffffffff | 1);
    fVar3 = fVar3 + fVar3;
  }
  else {
    fVar3 = (float)lVar1;
  }
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  uVar2 = (ulong)(fVar3 + 1.0);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,((long)((fVar3 + 1.0) - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2) >> 1,
             &local_11);
  init_rows(this);
  return;
}

Assistant:

compressed_distance_matrix(std::vector<value_t>&& _distances)
	    : distances(_distances), rows(size_t(1 + std::sqrt(value_t(1 + 8 * distances.size()))) / 2) {
		assert(distances.size() == size() * (size() - 1) / 2);
		init_rows();
	}